

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall Catch::TestSpecParser::processOtherChar(TestSpecParser *this,char c)

{
  switch(this->m_mode) {
  case None:
    if (c != '~') {
      return false;
    }
    break;
  case Name:
    if (c != '[') {
      return false;
    }
    break;
  case QuotedName:
    if (c != '\"') {
      return false;
    }
    break;
  case Tag:
    if ((c != '[') && (c != ']')) {
      return false;
    }
    break;
  case EscapedName:
    break;
  default:
    return false;
  }
  std::__cxx11::string::push_back((char)this + '@');
  endMode(this);
  return true;
}

Assistant:

bool TestSpecParser::isControlChar( char c ) const {
        switch( m_mode ) {
            default:
                return false;
            case None:
                return c == '~';
            case Name:
                return c == '[';
            case EscapedName:
                return true;
            case QuotedName:
                return c == '"';
            case Tag:
                return c == '[' || c == ']';
        }
    }